

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_buffermgr.cc
# Opt level: O0

RC __thiscall PF_BufferMgr::AllocatePage(PF_BufferMgr *this,int fd,PageNum pageNum,char **ppBuffer)

{
  int local_30;
  RC local_2c;
  int slot;
  RC rc;
  char **ppBuffer_local;
  PageNum pageNum_local;
  int fd_local;
  PF_BufferMgr *this_local;
  
  _slot = ppBuffer;
  ppBuffer_local._0_4_ = pageNum;
  ppBuffer_local._4_4_ = fd;
  _pageNum_local = this;
  local_2c = PF_HashTable::Find(&this->hashTable,fd,pageNum,&local_30);
  if (local_2c == 0) {
    this_local._4_4_ = -7;
  }
  else {
    this_local._4_4_ = local_2c;
    if ((local_2c == -8) &&
       (local_2c = InternalAlloc(this,&local_30), this_local._4_4_ = local_2c, local_2c == 0)) {
      local_2c = PF_HashTable::Insert
                           (&this->hashTable,ppBuffer_local._4_4_,(PageNum)ppBuffer_local,local_30);
      if ((local_2c == 0) &&
         (local_2c = InitPageDesc(this,ppBuffer_local._4_4_,(PageNum)ppBuffer_local,local_30),
         local_2c == 0)) {
        *_slot = this->bufTable[local_30].pData;
        this_local._4_4_ = 0;
      }
      else {
        Unlink(this,local_30);
        InsertFree(this,local_30);
        this_local._4_4_ = local_2c;
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

RC PF_BufferMgr::AllocatePage(int fd, PageNum pageNum, char **ppBuffer)
{
   RC  rc;     // return code
   int slot;   // buffer slot where page is located

#ifdef PF_LOG
   char psMessage[100];
   sprintf (psMessage, "Allocating a page for (%d,%d)....", fd, pageNum);
   WriteLog(psMessage);
#endif

   // If page is already in buffer, return an error
   if (!(rc = hashTable.Find(fd, pageNum, slot)))
      return (PF_PAGEINBUF);
   else if (rc != PF_HASHNOTFOUND)
      return (rc);              // unexpected error

   // Allocate an empty page
   if ((rc = InternalAlloc(slot)))
      return (rc);

   // Insert the page into the hash table,
   // and initialize the page description entry
   if ((rc = hashTable.Insert(fd, pageNum, slot)) ||
         (rc = InitPageDesc(fd, pageNum, slot))) {

      // Put the slot back on the free list before returning the error
      Unlink(slot);
      InsertFree(slot);
      return (rc);
   }

#ifdef PF_LOG
   WriteLog("Succesfully allocated page.\n");
#endif

   // Point ppBuffer to page
   *ppBuffer = bufTable[slot].pData;

   // Return ok
   return (0);
}